

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

void entryIncrease(UResourceDataEntry *entry)

{
  UResourceDataEntry *pUVar1;
  
  umtx_lock_63(&resbMutex);
  entry->fCountExisting = entry->fCountExisting + 1;
  for (pUVar1 = entry->fParent; pUVar1 != (UResourceDataEntry *)0x0; pUVar1 = pUVar1->fParent) {
    pUVar1->fCountExisting = pUVar1->fCountExisting + 1;
  }
  umtx_unlock_63(&resbMutex);
  return;
}

Assistant:

static void entryIncrease(UResourceDataEntry *entry) {
    umtx_lock(&resbMutex);
    entry->fCountExisting++;
    while(entry->fParent != NULL) {
      entry = entry->fParent;
      entry->fCountExisting++;
    }
    umtx_unlock(&resbMutex);
}